

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenTableVerifier
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr)

{
  pointer ppFVar1;
  CodeWriter code_;
  string local_250 [32];
  string local_230;
  CodeWriter local_210;
  
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  CodeWriter::CodeWriter(&local_210,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  GetStartOfTableVerifier(this,struct_def,code_ptr);
  for (ppFVar1 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar1 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar1 = ppFVar1 + 1) {
    if ((*ppFVar1)->deprecated == false) {
      GenVerifyCall(this,&local_210,*ppFVar1,"");
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string(local_250);
  GetEndOfTableVerifier(this,code_ptr);
  CodeWriter::~CodeWriter(&local_210);
  return;
}

Assistant:

void GenTableVerifier(const StructDef &struct_def, std::string *code_ptr) {
    CodeWriter code_;

    GetStartOfTableVerifier(struct_def, code_ptr);

    // Generate struct fields accessors
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenVerifyCall(code_, field, "");
    }

    *code_ptr += code_.ToString();

    GetEndOfTableVerifier(code_ptr);
  }